

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

void __thiscall ghc::filesystem::directory_entry::refresh(directory_entry *this)

{
  bool bVar1;
  file_type fVar2;
  undefined8 uVar3;
  long in_RDI;
  path *in_stack_00000020;
  string *in_stack_00000028;
  filesystem_error *in_stack_00000030;
  error_code in_stack_00000038;
  error_code ec;
  int in_stack_000001dc;
  error_code *in_stack_ffffffffffffff90;
  error_code *in_stack_ffffffffffffffa8;
  directory_entry *in_stack_ffffffffffffffb0;
  error_code local_18;
  
  std::error_code::error_code(in_stack_ffffffffffffff90);
  refresh(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  bVar1 = std::error_code::operator_cast_to_bool(&local_18);
  if ((bVar1) &&
     ((fVar2 = file_status::type((file_status *)(in_RDI + 0x20)), fVar2 == none ||
      (fVar2 = file_status::type((file_status *)(in_RDI + 0x28)), fVar2 != symlink)))) {
    uVar3 = __cxa_allocate_exception(0x90);
    std::error_code::value(&local_18);
    detail::systemErrorText<int>(in_stack_000001dc);
    filesystem_error::filesystem_error
              (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000038);
    __cxa_throw(uVar3,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
  }
  return;
}

Assistant:

GHC_INLINE void directory_entry::refresh()
{
    std::error_code ec;
    refresh(ec);
    if (ec && (_status.type() == file_type::none || _symlink_status.type() != file_type::symlink)) {
        throw filesystem_error(detail::systemErrorText(ec.value()), _path, ec);
    }
}